

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_remove<EasyUseHashMap<HashObject<8,8>,int,HashFn>>(int iters)

{
  int in_EDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  int in_stack_00000014;
  double ut;
  char *in_stack_00000020;
  int i;
  Rusage t;
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type *in_stack_ffffffffffffff78;
  HashObject<8,_8> *in_stack_ffffffffffffff80;
  Rusage *in_stack_ffffffffffffff90;
  int local_58;
  
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseHashMap
            ((EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d95c8);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff80);
  for (local_58 = 0; local_58 < in_EDI; local_58 = local_58 + 1) {
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    in_stack_ffffffffffffff80 =
         (HashObject<8,_8> *)
         std::
         unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::operator[]((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                       *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80->i_ = local_58 + 1;
  }
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff80);
  for (local_58 = 0; local_58 < in_EDI; local_58 = local_58 + 1) {
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    std::
    unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  Rusage::UserTime(in_stack_ffffffffffffff90);
  report(in_stack_00000020,ut,in_stack_00000014,in_stack_00000008,unaff_retaddr);
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn>::~EasyUseHashMap
            ((EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d96e3);
  return;
}

Assistant:

static void time_map_remove(int iters) {
  MapType set;
  Rusage t;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  t.Reset();
  for (i = 0; i < iters; i++) {
    set.erase(i);
  }
  double ut = t.UserTime();

  report("map_remove", ut, iters, 0, 0);
}